

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int gen_nested_loop_label_p(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  if (*(int *)&insn->field_0x18 != 0xb4) {
    __assert_fail("insn->code == MIR_LABEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2db,"int gen_nested_loop_label_p(gen_ctx_t, MIR_insn_t)");
  }
  iVar3 = 0;
  if (1 < gen_ctx->optimize_level) {
    lVar4 = *(long *)((long)insn->data + 0x30);
    lVar1 = *(long *)(lVar4 + 0x98);
    iVar3 = 0;
    if (lVar1 != 0) {
      lVar1 = *(long *)(lVar1 + 0x18);
      lVar2 = *(long *)(lVar1 + 0x10);
      iVar3 = 0;
      if ((lVar2 != 0) && (*(long *)(lVar2 + 8) == lVar4)) {
        for (lVar4 = *(long *)(lVar1 + 0x28); lVar4 != 0; lVar4 = *(long *)(lVar4 + 0x40)) {
          if (*(long *)(lVar4 + 8) == 0) {
            return 0;
          }
        }
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int MIR_UNUSED gen_nested_loop_label_p (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  gen_assert (insn->code == MIR_LABEL);
  if (optimize_level <= 1) return FALSE;
  bb_t bb = get_insn_bb (gen_ctx, insn);
  if (bb->loop_node == NULL) return FALSE;
  loop_node_t node, parent = bb->loop_node->parent;
  if (parent->entry == NULL || parent->entry->bb != bb) return FALSE;
  for (node = DLIST_HEAD (loop_node_t, parent->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) return FALSE; /* subloop */
  return TRUE;
}